

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  RayK<8> *pRVar3;
  RayK<8> *pRVar4;
  RTCRayQueryFlags RVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  RTCIntersectArguments *pRVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [24];
  undefined1 auVar48 [24];
  undefined1 auVar49 [24];
  undefined1 auVar50 [24];
  undefined1 auVar51 [24];
  undefined1 auVar52 [24];
  RTCIntersectArguments *pRVar53;
  undefined1 auVar54 [36];
  bool bVar55;
  int iVar56;
  long lVar57;
  undefined4 uVar58;
  RTCIntersectArguments *pRVar59;
  size_t *psVar60;
  ulong uVar61;
  ulong uVar62;
  NodeRef root;
  long lVar63;
  undefined1 (*pauVar64) [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [36];
  float fVar86;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [36];
  undefined1 auVar106 [64];
  uint uVar108;
  uint uVar111;
  uint uVar112;
  uint uVar113;
  undefined4 uVar114;
  undefined4 uVar115;
  undefined1 auVar109 [32];
  uint uVar116;
  undefined1 auVar110 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5da9;
  BVH *local_5da8;
  undefined1 local_5da0 [32];
  RayK<8> *local_5d80;
  Intersectors *local_5d78;
  RayQueryContext *local_5d70;
  RayK<8> *local_5d68;
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  uint local_5d20;
  undefined4 uStack_5d1c;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined1 local_5d00 [32];
  size_t local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [8];
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  float fStack_5c64;
  undefined1 local_5c60 [32];
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined4 local_5b20;
  undefined4 uStack_5b1c;
  uint uStack_5b18;
  uint uStack_5b14;
  uint uStack_5b10;
  uint uStack_5b0c;
  uint uStack_5b08;
  uint uStack_5b04;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  float local_5aa0;
  float fStack_5a9c;
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  float fStack_5a84;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar76 [36];
  
  local_5da8 = (BVH *)This->ptr;
  local_5808[0] = (local_5da8->root).ptr;
  if (local_5808[0] != 8) {
    pRVar59 = (RTCIntersectArguments *)ray;
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       (pRVar59 = context->args,
       (pRVar59->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar81 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar68 = ZEXT816(0) << 0x40;
      auVar87 = vpcmpeqd_avx2(auVar81,(undefined1  [32])valid_i->field_0);
      auVar81 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar68),5);
      auVar69 = auVar87 & auVar81;
      if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar69 >> 0x7f,0) != '\0') ||
            (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar69 >> 0xbf,0) != '\0') ||
          (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar69[0x1f] < '\0') {
        auVar81 = vandps_avx(auVar81,auVar87);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5c60._8_4_ = 0x7fffffff;
        local_5c60._0_8_ = 0x7fffffff7fffffff;
        local_5c60._12_4_ = 0x7fffffff;
        local_5c60._16_4_ = 0x7fffffff;
        local_5c60._20_4_ = 0x7fffffff;
        local_5c60._24_4_ = 0x7fffffff;
        local_5c60._28_4_ = 0x7fffffff;
        auVar119._8_4_ = 0x219392ef;
        auVar119._0_8_ = 0x219392ef219392ef;
        auVar119._12_4_ = 0x219392ef;
        auVar119._16_4_ = 0x219392ef;
        auVar119._20_4_ = 0x219392ef;
        auVar119._24_4_ = 0x219392ef;
        auVar119._28_4_ = 0x219392ef;
        auVar69 = vandps_avx(local_5c60,local_59e0);
        auVar69 = vcmpps_avx(auVar69,auVar119,1);
        auVar87 = vblendvps_avx(local_59e0,auVar119,auVar69);
        auVar69 = vandps_avx(local_5c60,local_59c0);
        auVar69 = vcmpps_avx(auVar69,auVar119,1);
        auVar88 = vblendvps_avx(local_59c0,auVar119,auVar69);
        auVar69 = vandps_avx(local_59a0,local_5c60);
        auVar69 = vcmpps_avx(auVar69,auVar119,1);
        auVar69 = vblendvps_avx(local_59a0,auVar119,auVar69);
        auVar11 = vpackssdw_avx(auVar81._0_16_,auVar81._16_16_);
        auVar82 = ZEXT1664(auVar11);
        auVar81 = vrcpps_avx(auVar87);
        auVar117._8_4_ = 0x3f800000;
        auVar117._0_8_ = 0x3f8000003f800000;
        auVar117._12_4_ = 0x3f800000;
        auVar117._16_4_ = 0x3f800000;
        auVar117._20_4_ = 0x3f800000;
        auVar117._24_4_ = 0x3f800000;
        auVar117._28_4_ = 0x3f800000;
        auVar19 = vfnmadd213ps_fma(auVar87,auVar81,auVar117);
        auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar81,auVar81);
        auVar81 = vrcpps_avx(auVar88);
        auVar20 = vfnmadd213ps_fma(auVar88,auVar81,auVar117);
        auVar87 = vrcpps_avx(auVar69);
        auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar81,auVar81);
        auVar21 = vfnmadd213ps_fma(auVar69,auVar87,auVar117);
        auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar87,auVar87);
        local_5980 = ZEXT1632(auVar19);
        local_5960 = ZEXT1632(auVar20);
        local_5940 = ZEXT1632(auVar21);
        local_5920 = auVar19._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar19._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar19._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar19._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar20._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar20._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar20._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar20._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar21._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar21._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar21._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar21._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar81 = vcmpps_avx(local_5980,ZEXT1632(auVar68),1);
        auVar87._8_4_ = 0x20;
        auVar87._0_8_ = 0x2000000020;
        auVar87._12_4_ = 0x20;
        auVar87._16_4_ = 0x20;
        auVar87._20_4_ = 0x20;
        auVar87._24_4_ = 0x20;
        auVar87._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar81,auVar87);
        auVar69 = ZEXT1632(auVar68);
        auVar81 = vcmpps_avx(ZEXT1632(auVar20),auVar69,5);
        auVar88._8_4_ = 0x40;
        auVar88._0_8_ = 0x4000000040;
        auVar88._12_4_ = 0x40;
        auVar88._16_4_ = 0x40;
        auVar88._20_4_ = 0x40;
        auVar88._24_4_ = 0x40;
        auVar88._28_4_ = 0x40;
        auVar94._8_4_ = 0x60;
        auVar94._0_8_ = 0x6000000060;
        auVar94._12_4_ = 0x60;
        auVar94._16_4_ = 0x60;
        auVar94._20_4_ = 0x60;
        auVar94._24_4_ = 0x60;
        auVar94._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar94,auVar88,auVar81);
        auVar81 = vcmpps_avx(ZEXT1632(auVar21),auVar69,5);
        auVar89._8_4_ = 0x80;
        auVar89._0_8_ = 0x8000000080;
        auVar89._12_4_ = 0x80;
        auVar89._16_4_ = 0x80;
        auVar89._20_4_ = 0x80;
        auVar89._24_4_ = 0x80;
        auVar89._28_4_ = 0x80;
        auVar95._8_4_ = 0xa0;
        auVar95._0_8_ = 0xa0000000a0;
        auVar95._12_4_ = 0xa0;
        auVar95._16_4_ = 0xa0;
        auVar95._20_4_ = 0xa0;
        auVar95._24_4_ = 0xa0;
        auVar95._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar95,auVar89,auVar81);
        auVar81 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar69);
        local_5b60 = vpmovsxwd_avx2(auVar11);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar118 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar81,local_5b60);
        auVar81 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar69);
        auVar69._8_4_ = 0xff800000;
        auVar69._0_8_ = 0xff800000ff800000;
        auVar69._12_4_ = 0xff800000;
        auVar69._16_4_ = 0xff800000;
        auVar69._20_4_ = 0xff800000;
        auVar69._24_4_ = 0xff800000;
        auVar69._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar69,auVar81,local_5b60);
        auVar68 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5d60 = vpmovsxwd_avx2(auVar11 ^ auVar68);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar62 = 7;
        }
        else {
          pRVar59 = (RTCIntersectArguments *)
                    (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT);
          uVar62 = (long)pRVar59 * 5 + 2;
        }
        local_5d68 = ray + 0x100;
        psVar60 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar64 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        local_5d78 = This;
        local_5d80 = ray;
        local_5d70 = context;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_016a3713:
        do {
          do {
            root.ptr = psVar60[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_016a40b1;
            psVar60 = psVar60 + -1;
            pauVar64 = pauVar64 + -1;
            local_5d00 = *pauVar64;
            auVar120 = ZEXT3264(local_5d00);
            auVar81 = vcmpps_avx(local_5d00,local_5840,1);
          } while ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar81 >> 0x7f,0) == '\0') &&
                     (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar81 >> 0xbf,0) == '\0') &&
                   (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar81[0x1f]);
          uVar58 = vmovmskps_avx(auVar81);
          pRVar59 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar59 >> 0x20),uVar58);
          local_5d20 = POPCOUNT(uVar58);
          if (uVar62 < local_5d20) {
LAB_016a3750:
            do {
              if ((root.ptr & 8) != 0) {
                if ((RTCIntersectArguments *)root.ptr ==
                    (RTCIntersectArguments *)&DAT_fffffffffffffff8) goto LAB_016a40b1;
                local_5b40 = local_5840;
                auVar81 = vcmpps_avx(local_5840,auVar120._0_32_,6);
                if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar81 >> 0x7f,0) == '\0') &&
                      (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar81 >> 0xbf,0) == '\0') &&
                    (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar81[0x1f]) goto LAB_016a3713;
                local_5b20 = local_5d60._0_4_;
                uStack_5b1c = local_5d60._4_4_;
                uStack_5b18 = local_5d60._8_4_;
                uStack_5b14 = local_5d60._12_4_;
                uStack_5b10 = local_5d60._16_4_;
                uStack_5b0c = local_5d60._20_4_;
                uStack_5b08 = local_5d60._24_4_;
                uStack_5b04 = local_5d60._28_4_;
                local_5d40._0_8_ = local_5d60._0_8_ ^ 0xffffffffffffffff;
                local_5d40._8_4_ = local_5d60._8_4_ ^ 0xffffffff;
                local_5d40._12_4_ = local_5d60._12_4_ ^ 0xffffffff;
                local_5d40._16_4_ = local_5d60._16_4_ ^ 0xffffffff;
                local_5d40._20_4_ = local_5d60._20_4_ ^ 0xffffffff;
                local_5d40._24_4_ = local_5d60._24_4_ ^ 0xffffffff;
                local_5d40._28_4_ = local_5d60._28_4_ ^ 0xffffffff;
                uStack_5cd8 = *(undefined8 *)(local_5d80 + 8);
                uStack_5cd0 = *(undefined8 *)(local_5d80 + 0x10);
                uStack_5cc8 = *(undefined8 *)(local_5d80 + 0x18);
                uStack_5d18 = *(undefined8 *)(local_5d80 + 0x48);
                uStack_5d10 = *(undefined8 *)(local_5d80 + 0x50);
                uStack_5d08 = *(undefined8 *)(local_5d80 + 0x58);
                uVar34 = *(undefined8 *)(local_5d80 + 0x60);
                uVar35 = *(undefined8 *)(local_5d80 + 0x68);
                uVar36 = *(undefined8 *)(local_5d80 + 0x70);
                uStack_5be8 = *(undefined8 *)(local_5d80 + 0x78);
                pRVar1 = local_5d80 + 0xa0;
                local_5ba0 = *(undefined8 *)pRVar1;
                uStack_5b98 = *(undefined8 *)(local_5d80 + 0xa8);
                uStack_5b90 = *(undefined8 *)(local_5d80 + 0xb0);
                auVar50 = *(undefined1 (*) [24])pRVar1;
                auVar49 = *(undefined1 (*) [24])pRVar1;
                uStack_5b88 = *(undefined8 *)(local_5d80 + 0xb8);
                pRVar2 = local_5d80 + 0xc0;
                local_5bc0 = *(undefined8 *)pRVar2;
                uStack_5bb8 = *(undefined8 *)(local_5d80 + 200);
                uStack_5bb0 = *(undefined8 *)(local_5d80 + 0xd0);
                auVar51 = *(undefined1 (*) [24])pRVar2;
                auVar47 = *(undefined1 (*) [24])pRVar2;
                uStack_5ba8 = *(undefined8 *)(local_5d80 + 0xd8);
                pRVar3 = local_5d80 + 0x80;
                local_5be0 = *(undefined8 *)pRVar3;
                uStack_5bd8 = *(undefined8 *)(local_5d80 + 0x88);
                uStack_5bd0 = *(undefined8 *)(local_5d80 + 0x90);
                auVar52 = *(undefined1 (*) [24])pRVar3;
                auVar48 = *(undefined1 (*) [24])pRVar3;
                uStack_5bc8 = *(undefined8 *)(local_5d80 + 0x98);
                uVar37 = *(undefined8 *)(local_5d80 + 0x100);
                uVar38 = *(undefined8 *)(local_5d80 + 0x108);
                uVar39 = *(undefined8 *)(local_5d80 + 0x110);
                uStack_5c08 = *(undefined8 *)(local_5d80 + 0x118);
                pRVar4 = local_5d80 + 0x120;
                local_5c40 = *(undefined8 *)pRVar4;
                uStack_5c38 = *(undefined8 *)(local_5d80 + 0x128);
                uStack_5c30 = *(undefined8 *)(local_5d80 + 0x130);
                uStack_5c28 = *(undefined8 *)(local_5d80 + 0x138);
                lVar63 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar57 = 0;
                goto LAB_016a39d6;
              }
              pRVar59 = (RTCIntersectArguments *)0x8;
              auVar81 = auVar118._0_32_;
              for (lVar57 = 0;
                  (auVar120 = ZEXT3264(auVar81), lVar57 != 8 &&
                  (pRVar9 = *(RTCIntersectArguments **)
                             ((root.ptr & 0xfffffffffffffff0) + lVar57 * 8),
                  pRVar9 != (RTCIntersectArguments *)0x8)); lVar57 = lVar57 + 1) {
                RVar5 = (&((RTCIntersectArguments *)(root.ptr + 0x40))->flags)[lVar57];
                auVar70._4_4_ = RVar5;
                auVar70._0_4_ = RVar5;
                auVar70._8_4_ = RVar5;
                auVar70._12_4_ = RVar5;
                auVar70._16_4_ = RVar5;
                auVar70._20_4_ = RVar5;
                auVar70._24_4_ = RVar5;
                auVar70._28_4_ = RVar5;
                auVar44._4_4_ = fStack_591c;
                auVar44._0_4_ = local_5920;
                auVar44._8_4_ = fStack_5918;
                auVar44._12_4_ = fStack_5914;
                auVar44._16_4_ = fStack_5910;
                auVar44._20_4_ = fStack_590c;
                auVar44._24_4_ = fStack_5908;
                auVar44._28_4_ = uStack_5904;
                RVar5 = (&((RTCIntersectArguments *)(root.ptr + 0x80))->flags)[lVar57];
                auVar96._4_4_ = RVar5;
                auVar96._0_4_ = RVar5;
                auVar96._8_4_ = RVar5;
                auVar96._12_4_ = RVar5;
                auVar96._16_4_ = RVar5;
                auVar96._20_4_ = RVar5;
                auVar96._24_4_ = RVar5;
                auVar96._28_4_ = RVar5;
                auVar68 = vfmsub213ps_fma(auVar70,local_5980,auVar44);
                auVar45._4_4_ = fStack_58fc;
                auVar45._0_4_ = local_5900;
                auVar45._8_4_ = fStack_58f8;
                auVar45._12_4_ = fStack_58f4;
                auVar45._16_4_ = fStack_58f0;
                auVar45._20_4_ = fStack_58ec;
                auVar45._24_4_ = fStack_58e8;
                auVar45._28_4_ = uStack_58e4;
                RVar5 = (&((RTCIntersectArguments *)(root.ptr + 0xc0))->flags)[lVar57];
                auVar101._4_4_ = RVar5;
                auVar101._0_4_ = RVar5;
                auVar101._8_4_ = RVar5;
                auVar101._12_4_ = RVar5;
                auVar101._16_4_ = RVar5;
                auVar101._20_4_ = RVar5;
                auVar101._24_4_ = RVar5;
                auVar101._28_4_ = RVar5;
                auVar11 = vfmsub213ps_fma(auVar96,local_5960,auVar45);
                auVar46._4_4_ = fStack_58dc;
                auVar46._0_4_ = local_58e0;
                auVar46._8_4_ = fStack_58d8;
                auVar46._12_4_ = fStack_58d4;
                auVar46._16_4_ = fStack_58d0;
                auVar46._20_4_ = fStack_58cc;
                auVar46._24_4_ = fStack_58c8;
                auVar46._28_4_ = uStack_58c4;
                RVar5 = (&((RTCIntersectArguments *)(root.ptr + 0x60))->flags)[lVar57];
                auVar109._4_4_ = RVar5;
                auVar109._0_4_ = RVar5;
                auVar109._8_4_ = RVar5;
                auVar109._12_4_ = RVar5;
                auVar109._16_4_ = RVar5;
                auVar109._20_4_ = RVar5;
                auVar109._24_4_ = RVar5;
                auVar109._28_4_ = RVar5;
                auVar19 = vfmsub213ps_fma(auVar101,local_5940,auVar46);
                auVar20 = vfmsub213ps_fma(auVar109,local_5980,auVar44);
                RVar5 = (&((RTCIntersectArguments *)(root.ptr + 0xa0))->flags)[lVar57];
                auVar90._4_4_ = RVar5;
                auVar90._0_4_ = RVar5;
                auVar90._8_4_ = RVar5;
                auVar90._12_4_ = RVar5;
                auVar90._16_4_ = RVar5;
                auVar90._20_4_ = RVar5;
                auVar90._24_4_ = RVar5;
                auVar90._28_4_ = RVar5;
                auVar21 = vfmsub213ps_fma(auVar90,local_5960,auVar45);
                RVar5 = (&((RTCIntersectArguments *)(root.ptr + 0xe0))->flags)[lVar57];
                auVar77._4_4_ = RVar5;
                auVar77._0_4_ = RVar5;
                auVar77._8_4_ = RVar5;
                auVar77._12_4_ = RVar5;
                auVar77._16_4_ = RVar5;
                auVar77._20_4_ = RVar5;
                auVar77._24_4_ = RVar5;
                auVar77._28_4_ = RVar5;
                auVar16 = vfmsub213ps_fma(auVar77,local_5940,auVar46);
                auVar69 = vpminsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar20));
                auVar87 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar21));
                auVar69 = vpmaxsd_avx2(auVar69,auVar87);
                auVar87 = vpminsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar16));
                auVar88 = vpmaxsd_avx2(auVar69,auVar87);
                auVar69 = vpmaxsd_avx2(ZEXT1632(auVar68),ZEXT1632(auVar20));
                auVar87 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar21));
                auVar87 = vpminsd_avx2(auVar69,auVar87);
                auVar69 = vpmaxsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar16));
                auVar87 = vpminsd_avx2(auVar87,auVar69);
                auVar69 = vpmaxsd_avx2(auVar88,local_5860);
                auVar82 = ZEXT3264(auVar69);
                auVar87 = vpminsd_avx2(auVar87,local_5840);
                auVar87 = vcmpps_avx(auVar69,auVar87,2);
                pRVar53 = pRVar59;
                auVar69 = auVar81;
                if (((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar87 >> 0x7f,0) != '\0') ||
                       (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar87 >> 0xbf,0) != '\0') ||
                     (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar87[0x1f] < '\0') &&
                   (auVar69 = vblendvps_avx(auVar118._0_32_,auVar88,auVar87), pRVar53 = pRVar9,
                   pRVar59 != (RTCIntersectArguments *)0x8)) {
                  *psVar60 = (size_t)pRVar59;
                  psVar60 = psVar60 + 1;
                  *pauVar64 = auVar81;
                  pauVar64 = pauVar64 + 1;
                }
                auVar81 = auVar69;
                pRVar59 = pRVar53;
              }
              if (pRVar59 == (RTCIntersectArguments *)0x8) goto LAB_016a38cc;
              auVar69 = vcmpps_avx(local_5840,auVar81,6);
              uVar58 = vmovmskps_avx(auVar69);
              root.ptr = (size_t)pRVar59;
            } while ((byte)uVar62 < (byte)POPCOUNT(uVar58));
            *psVar60 = (size_t)pRVar59;
            psVar60 = psVar60 + 1;
            *pauVar64 = auVar81;
            pauVar64 = pauVar64 + 1;
LAB_016a38cc:
            iVar56 = 4;
          }
          else {
            uStack_5d1c = 0;
            while (pRVar59 != (RTCIntersectArguments *)0x0) {
              local_5ce0 = 0;
              for (pRVar9 = pRVar59; ((ulong)pRVar9 & 1) == 0;
                  pRVar9 = (RTCIntersectArguments *)((ulong)pRVar9 >> 1 | 0x8000000000000000)) {
                local_5ce0 = local_5ce0 + 1;
              }
              local_5da0._0_8_ = (ulong)((long)&pRVar59[-1].intersect + 7U) & (ulong)pRVar59;
              auVar82 = ZEXT1664(auVar82._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              bVar55 = occluded1(local_5d78,local_5da8,root,local_5ce0,&local_5da9,local_5d80,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,local_5d70);
              pRVar59 = (RTCIntersectArguments *)local_5da0._0_8_;
              if (bVar55) {
                *(undefined4 *)(local_5d60 + local_5ce0 * 4) = 0xffffffff;
              }
            }
            auVar81 = _DAT_01f7b020 & ~local_5d60;
            iVar56 = 3;
            auVar118 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar120 = ZEXT3264(local_5d00);
            if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar81 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar81 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar81 >> 0x7f,0) != '\0') ||
                  (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar81 >> 0xbf,0) != '\0') ||
                (auVar81 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar81[0x1f] < '\0') {
              auVar81._8_4_ = 0xff800000;
              auVar81._0_8_ = 0xff800000ff800000;
              auVar81._12_4_ = 0xff800000;
              auVar81._16_4_ = 0xff800000;
              auVar81._20_4_ = 0xff800000;
              auVar81._24_4_ = 0xff800000;
              auVar81._28_4_ = 0xff800000;
              auVar82 = ZEXT3264(auVar81);
              local_5840 = vblendvps_avx(local_5840,auVar81,local_5d60);
              iVar56 = 2;
            }
            pRVar59 = (RTCIntersectArguments *)0x0;
            if ((uint)uVar62 < local_5d20) goto LAB_016a3750;
            pRVar59 = (RTCIntersectArguments *)0x0;
          }
        } while (iVar56 != 3);
LAB_016a40b1:
        auVar81 = vandps_avx(local_5b60,local_5d60);
        auVar75._8_4_ = 0xff800000;
        auVar75._0_8_ = 0xff800000ff800000;
        auVar75._12_4_ = 0xff800000;
        auVar75._16_4_ = 0xff800000;
        auVar75._20_4_ = 0xff800000;
        auVar75._24_4_ = 0xff800000;
        auVar75._28_4_ = 0xff800000;
        auVar81 = vmaskmovps_avx(auVar81,auVar75);
        *(undefined1 (*) [32])local_5d68 = auVar81;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_016a39d6:
  auVar81 = auVar82._0_32_;
  if (lVar57 != (ulong)((uint)root.ptr & 0xf) - 8) {
    pRVar59 = (RTCIntersectArguments *)&DAT_fffffffffffffff0;
    auVar82 = ZEXT3264(local_5d40);
    do {
      auVar81 = auVar82._0_32_;
      auVar69 = auVar81;
      if ((pRVar59 == (RTCIntersectArguments *)0x0) ||
         (uVar61 = (ulong)*(uint *)((long)&pRVar59->filter + lVar63), uVar61 == 0xffffffff))
      goto LAB_016a3f42;
      fVar6 = *(float *)(lVar63 + -0xb0 + (long)pRVar59);
      auVar97._4_4_ = fVar6;
      auVar97._0_4_ = fVar6;
      auVar97._8_4_ = fVar6;
      auVar97._12_4_ = fVar6;
      auVar97._16_4_ = fVar6;
      auVar97._20_4_ = fVar6;
      auVar97._24_4_ = fVar6;
      auVar97._28_4_ = fVar6;
      fVar7 = *(float *)((long)&pRVar59[-5].flags + lVar63);
      auVar121._4_4_ = fVar7;
      auVar121._0_4_ = fVar7;
      auVar121._8_4_ = fVar7;
      auVar121._12_4_ = fVar7;
      auVar121._16_4_ = fVar7;
      auVar121._20_4_ = fVar7;
      auVar121._24_4_ = fVar7;
      auVar121._28_4_ = fVar7;
      fVar8 = *(float *)(lVar63 + -0x90 + (long)pRVar59);
      auVar122._4_4_ = fVar8;
      auVar122._0_4_ = fVar8;
      auVar122._8_4_ = fVar8;
      auVar122._12_4_ = fVar8;
      auVar122._16_4_ = fVar8;
      auVar122._20_4_ = fVar8;
      auVar122._24_4_ = fVar8;
      auVar122._28_4_ = fVar8;
      local_5c80._4_4_ = *(float *)((long)&pRVar59[-4].flags + lVar63);
      local_5ca0._4_4_ = *(float *)(lVar63 + -0x70 + (long)pRVar59);
      local_5a60 = *(float *)((long)&pRVar59[-3].flags + lVar63);
      local_5a80 = *(float *)(lVar63 + -0x10 + (long)pRVar59);
      local_5aa0 = *(float *)((long)&pRVar59->flags + lVar63);
      local_5c80._0_4_ = local_5c80._4_4_;
      fStack_5c78 = (float)local_5c80._4_4_;
      fStack_5c74 = (float)local_5c80._4_4_;
      fStack_5c70 = (float)local_5c80._4_4_;
      fStack_5c6c = (float)local_5c80._4_4_;
      fStack_5c68 = (float)local_5c80._4_4_;
      fStack_5c64 = (float)local_5c80._4_4_;
      fVar12 = fVar6 - (float)local_5c80._4_4_;
      auVar105._4_4_ = fVar12;
      auVar105._0_4_ = fVar12;
      auVar105._8_4_ = fVar12;
      auVar105._12_4_ = fVar12;
      auVar105._16_4_ = fVar12;
      auVar105._20_4_ = fVar12;
      auVar105._24_4_ = fVar12;
      auVar105._28_4_ = fVar12;
      local_5ca0._0_4_ = local_5ca0._4_4_;
      fStack_5c98 = (float)local_5ca0._4_4_;
      fStack_5c94 = (float)local_5ca0._4_4_;
      fStack_5c90 = (float)local_5ca0._4_4_;
      fStack_5c8c = (float)local_5ca0._4_4_;
      fStack_5c88 = (float)local_5ca0._4_4_;
      fStack_5c84 = (float)local_5ca0._4_4_;
      fVar13 = fVar7 - (float)local_5ca0._4_4_;
      fVar14 = fVar8 - local_5a60;
      local_5ae0._4_4_ = fVar14;
      local_5ae0._0_4_ = fVar14;
      local_5ae0._8_4_ = fVar14;
      local_5ae0._12_4_ = fVar14;
      local_5ae0._16_4_ = fVar14;
      local_5ae0._20_4_ = fVar14;
      local_5ae0._24_4_ = fVar14;
      local_5ae0._28_4_ = fVar14;
      fVar7 = local_5a80 - fVar7;
      auVar123._4_4_ = fVar7;
      auVar123._0_4_ = fVar7;
      auVar123._8_4_ = fVar7;
      auVar123._12_4_ = fVar7;
      auVar123._16_4_ = fVar7;
      auVar123._20_4_ = fVar7;
      auVar123._24_4_ = fVar7;
      auVar123._28_4_ = fVar7;
      fVar8 = local_5aa0 - fVar8;
      fVar10 = fVar12 * fVar7;
      auVar71._4_4_ = fVar8;
      auVar71._0_4_ = fVar8;
      auVar71._8_4_ = fVar8;
      auVar71._12_4_ = fVar8;
      auVar71._16_4_ = fVar8;
      auVar71._20_4_ = fVar8;
      auVar71._24_4_ = fVar8;
      auVar71._28_4_ = fVar8;
      fVar86 = fVar13 * fVar8;
      auVar99._4_4_ = fVar86;
      auVar99._0_4_ = fVar86;
      auVar99._8_4_ = fVar86;
      auVar99._12_4_ = fVar86;
      auVar99._16_4_ = fVar86;
      auVar99._20_4_ = fVar86;
      auVar99._24_4_ = fVar86;
      auVar99._28_4_ = fVar86;
      auVar19 = vfmsub231ps_fma(auVar99,auVar123,local_5ae0);
      local_5ac0 = *(float *)((long)&pRVar59[-1].flags + lVar63);
      fVar6 = local_5ac0 - fVar6;
      fVar86 = fVar6 * fVar14;
      auVar91._4_4_ = fVar86;
      auVar91._0_4_ = fVar86;
      auVar91._8_4_ = fVar86;
      auVar91._12_4_ = fVar86;
      auVar91._16_4_ = fVar86;
      auVar91._20_4_ = fVar86;
      auVar91._24_4_ = fVar86;
      auVar91._28_4_ = fVar86;
      auVar20 = vfmsub231ps_fma(auVar91,auVar71,auVar105);
      auVar87 = vsubps_avx(auVar97,*(undefined1 (*) [32])local_5d80);
      auVar83 = ZEXT436(auVar87._28_4_);
      auVar88 = vsubps_avx(auVar121,*(undefined1 (*) [32])(local_5d80 + 0x20));
      auVar89 = vsubps_avx(auVar122,*(undefined1 (*) [32])(local_5d80 + 0x40));
      auVar82._0_4_ = auVar47._0_4_ * auVar87._0_4_;
      auVar82._4_4_ = auVar47._4_4_ * auVar87._4_4_;
      auVar82._8_4_ = auVar47._8_4_ * auVar87._8_4_;
      auVar82._12_4_ = auVar47._12_4_ * auVar87._12_4_;
      auVar82._16_4_ = auVar47._16_4_ * auVar87._16_4_;
      auVar82._20_4_ = auVar47._20_4_ * auVar87._20_4_;
      fVar86 = (float)uStack_5ba8;
      auVar82._28_36_ = in_ZMM15._28_36_;
      auVar82._24_4_ = fVar86 * auVar87._24_4_;
      auVar21 = vfmsub231ps_fma(auVar82._0_32_,auVar89,*(undefined1 (*) [32])pRVar3);
      in_ZMM15 = ZEXT1664(auVar21);
      auVar22._4_4_ = auVar88._4_4_ * auVar48._4_4_;
      auVar22._0_4_ = auVar88._0_4_ * auVar48._0_4_;
      auVar22._8_4_ = auVar88._8_4_ * auVar48._8_4_;
      auVar22._12_4_ = auVar88._12_4_ * auVar48._12_4_;
      auVar22._16_4_ = auVar88._16_4_ * auVar48._16_4_;
      auVar22._20_4_ = auVar88._20_4_ * auVar48._20_4_;
      auVar22._24_4_ = auVar88._24_4_ * (float)uStack_5bc8;
      auVar22._28_4_ = fVar12;
      auVar16 = vfmsub231ps_fma(auVar22,auVar87,*(undefined1 (*) [32])pRVar1);
      auVar107 = (undefined1  [36])0x0;
      auVar23._4_4_ = auVar16._4_4_ * fVar8;
      auVar23._0_4_ = auVar16._0_4_ * fVar8;
      auVar23._8_4_ = auVar16._8_4_ * fVar8;
      auVar23._12_4_ = auVar16._12_4_ * fVar8;
      auVar23._16_4_ = fVar8 * 0.0;
      auVar23._20_4_ = fVar8 * 0.0;
      auVar23._24_4_ = fVar8 * 0.0;
      auVar23._28_4_ = fVar8;
      auVar68 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar21),auVar123);
      local_5b00._4_4_ = fVar13;
      local_5b00._0_4_ = fVar13;
      local_5b00._8_4_ = fVar13;
      local_5b00._12_4_ = fVar13;
      local_5b00._16_4_ = fVar13;
      local_5b00._20_4_ = fVar13;
      local_5b00._24_4_ = fVar13;
      local_5b00._28_4_ = fVar13;
      auVar65._4_4_ = fVar6;
      auVar65._0_4_ = fVar6;
      auVar65._8_4_ = fVar6;
      auVar65._12_4_ = fVar6;
      auVar65._16_4_ = fVar6;
      auVar65._20_4_ = fVar6;
      auVar65._24_4_ = fVar6;
      auVar65._28_4_ = fVar6;
      auVar102._4_4_ = fVar10;
      auVar102._0_4_ = fVar10;
      auVar102._8_4_ = fVar10;
      auVar102._12_4_ = fVar10;
      auVar102._16_4_ = fVar10;
      auVar102._20_4_ = fVar10;
      auVar102._24_4_ = fVar10;
      auVar102._28_4_ = fVar10;
      auVar17 = vfmsub231ps_fma(auVar102,auVar65,local_5b00);
      auVar24._4_4_ = auVar49._4_4_ * auVar89._4_4_;
      auVar24._0_4_ = auVar49._0_4_ * auVar89._0_4_;
      auVar24._8_4_ = auVar49._8_4_ * auVar89._8_4_;
      auVar24._12_4_ = auVar49._12_4_ * auVar89._12_4_;
      auVar24._16_4_ = auVar49._16_4_ * auVar89._16_4_;
      auVar24._20_4_ = auVar49._20_4_ * auVar89._20_4_;
      auVar24._24_4_ = (float)uStack_5b88 * auVar89._24_4_;
      auVar24._28_4_ = fVar13;
      auVar18 = vfmsub231ps_fma(auVar24,auVar88,*(undefined1 (*) [32])pRVar2);
      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar18),auVar65);
      auVar25._4_4_ = auVar17._4_4_ * auVar47._4_4_;
      auVar25._0_4_ = auVar17._0_4_ * auVar47._0_4_;
      auVar25._8_4_ = auVar17._8_4_ * auVar47._8_4_;
      auVar25._12_4_ = auVar17._12_4_ * auVar47._12_4_;
      auVar25._16_4_ = auVar47._16_4_ * 0.0;
      auVar25._20_4_ = auVar47._20_4_ * 0.0;
      auVar25._24_4_ = fVar86 * 0.0;
      auVar25._28_4_ = fVar7;
      auVar11 = vfmadd231ps_fma(auVar25,ZEXT1632(auVar20),*(undefined1 (*) [32])pRVar1);
      auVar95 = ZEXT1632(auVar19);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar95,*(undefined1 (*) [32])pRVar3);
      auVar82 = ZEXT3264(auVar81);
      local_5cc0._8_4_ = 0x80000000;
      local_5cc0._0_8_ = 0x8000000080000000;
      local_5cc0._12_4_ = 0x80000000;
      local_5cc0._16_4_ = 0x80000000;
      local_5cc0._20_4_ = 0x80000000;
      local_5cc0._24_4_ = 0x80000000;
      local_5cc0._28_4_ = 0x80000000;
      auVar69 = vandps_avx(ZEXT1632(auVar11),local_5cc0);
      uVar108 = auVar69._0_4_;
      auVar72._0_4_ = uVar108 ^ auVar68._0_4_;
      uVar111 = auVar69._4_4_;
      auVar72._4_4_ = uVar111 ^ auVar68._4_4_;
      uVar112 = auVar69._8_4_;
      auVar72._8_4_ = uVar112 ^ auVar68._8_4_;
      uVar113 = auVar69._12_4_;
      auVar72._12_4_ = uVar113 ^ auVar68._12_4_;
      uVar58 = auVar69._16_4_;
      auVar72._16_4_ = uVar58;
      uVar114 = auVar69._20_4_;
      auVar72._20_4_ = uVar114;
      uVar115 = auVar69._24_4_;
      auVar72._24_4_ = uVar115;
      uVar116 = auVar69._28_4_;
      auVar72._28_4_ = uVar116;
      auVar76 = ZEXT436(uVar116);
      auVar69 = vcmpps_avx(auVar72,_DAT_01f7b000,5);
      auVar94 = auVar81 & auVar69;
      local_5c00._0_4_ = (float)uVar34;
      local_5c00._4_4_ = (float)((ulong)uVar34 >> 0x20);
      uStack_5bf8._0_4_ = (float)uVar35;
      uStack_5bf8._4_4_ = (float)((ulong)uVar35 >> 0x20);
      uStack_5bf0._0_4_ = (float)uVar36;
      uStack_5bf0._4_4_ = (float)((ulong)uVar36 >> 0x20);
      local_5c20._0_4_ = (float)uVar37;
      local_5c20._4_4_ = (float)((ulong)uVar37 >> 0x20);
      uStack_5c18._0_4_ = (float)uVar38;
      uStack_5c18._4_4_ = (float)((ulong)uVar38 >> 0x20);
      uStack_5c10._0_4_ = (float)uVar39;
      uStack_5c10._4_4_ = (float)((ulong)uVar39 >> 0x20);
      if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar94 >> 0x7f,0) != '\0') ||
            (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar94 >> 0xbf,0) != '\0') ||
          (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar94[0x1f] < '\0') {
        auVar69 = vandps_avx(auVar69,auVar81);
        auVar31._4_4_ = auVar16._4_4_ * fVar14;
        auVar31._0_4_ = auVar16._0_4_ * fVar14;
        auVar31._8_4_ = auVar16._8_4_ * fVar14;
        auVar31._12_4_ = auVar16._12_4_ * fVar14;
        auVar31._16_4_ = fVar14 * 0.0;
        auVar31._20_4_ = fVar14 * 0.0;
        auVar31._24_4_ = fVar14 * 0.0;
        auVar31._28_4_ = (int)((ulong)uStack_5ba8 >> 0x20);
        auVar68 = vfmadd213ps_fma(local_5b00,ZEXT1632(auVar21),auVar31);
        auVar68 = vfmadd213ps_fma(auVar105,ZEXT1632(auVar18),ZEXT1632(auVar68));
        auVar100._0_4_ = uVar108 ^ auVar68._0_4_;
        auVar100._4_4_ = uVar111 ^ auVar68._4_4_;
        auVar100._8_4_ = uVar112 ^ auVar68._8_4_;
        auVar100._12_4_ = uVar113 ^ auVar68._12_4_;
        auVar100._16_4_ = uVar58;
        auVar100._20_4_ = uVar114;
        auVar100._24_4_ = uVar115;
        auVar100._28_4_ = uVar116;
        auVar94 = vcmpps_avx(auVar100,_DAT_01f7b000,5);
        auVar107 = ZEXT436(auVar94._28_4_);
        auVar117 = auVar69 & auVar94;
        local_5b80 = auVar95;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0x7f,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar117 >> 0xbf,0) != '\0') ||
            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar117[0x1f] < '\0') {
          auVar117 = vandps_avx(ZEXT1632(auVar11),local_5c60);
          auVar69 = vandps_avx(auVar94,auVar69);
          auVar107 = ZEXT436(auVar69._28_4_);
          auVar94 = vsubps_avx(auVar117,auVar72);
          auVar94 = vcmpps_avx(auVar94,auVar100,5);
          auVar76 = ZEXT436(auVar94._28_4_);
          auVar119 = auVar69 & auVar94;
          if ((((((((auVar119 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar119 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar119 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar119 >> 0x7f,0) != '\0') ||
                (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar119 >> 0xbf,0) != '\0') ||
              (auVar119 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar119[0x1f] < '\0') {
            auVar69 = vandps_avx(auVar69,auVar94);
            auVar76 = ZEXT436(auVar69._28_4_);
            auVar32._4_4_ = auVar89._4_4_ * auVar17._4_4_;
            auVar32._0_4_ = auVar89._0_4_ * auVar17._0_4_;
            auVar32._8_4_ = auVar89._8_4_ * auVar17._8_4_;
            auVar32._12_4_ = auVar89._12_4_ * auVar17._12_4_;
            auVar32._16_4_ = auVar89._16_4_ * 0.0;
            auVar32._20_4_ = auVar89._20_4_ * 0.0;
            auVar32._24_4_ = auVar89._24_4_ * 0.0;
            auVar32._28_4_ = uVar116;
            auVar68 = vfmadd213ps_fma(auVar88,ZEXT1632(auVar20),auVar32);
            auVar68 = vfmadd132ps_fma(auVar87,ZEXT1632(auVar68),auVar95);
            auVar78._0_4_ = uVar108 ^ auVar68._0_4_;
            auVar78._4_4_ = uVar111 ^ auVar68._4_4_;
            auVar78._8_4_ = uVar112 ^ auVar68._8_4_;
            auVar78._12_4_ = uVar113 ^ auVar68._12_4_;
            auVar78._16_4_ = uVar58;
            auVar78._20_4_ = uVar114;
            auVar78._24_4_ = uVar115;
            auVar78._28_4_ = uVar116;
            auVar92._0_4_ = auVar117._0_4_ * (float)local_5c00;
            auVar92._4_4_ = auVar117._4_4_ * local_5c00._4_4_;
            auVar92._8_4_ = auVar117._8_4_ * (float)uStack_5bf8;
            auVar92._12_4_ = auVar117._12_4_ * uStack_5bf8._4_4_;
            auVar92._16_4_ = auVar117._16_4_ * (float)uStack_5bf0;
            auVar92._20_4_ = auVar117._20_4_ * uStack_5bf0._4_4_;
            auVar92._24_4_ = auVar117._24_4_ * (float)uStack_5be8;
            auVar92._28_4_ = 0;
            auVar87 = vcmpps_avx(auVar92,auVar78,1);
            auVar33._4_4_ = auVar117._4_4_ * local_5c20._4_4_;
            auVar33._0_4_ = auVar117._0_4_ * (float)local_5c20;
            auVar33._8_4_ = auVar117._8_4_ * (float)uStack_5c18;
            auVar33._12_4_ = auVar117._12_4_ * uStack_5c18._4_4_;
            auVar33._16_4_ = auVar117._16_4_ * (float)uStack_5c10;
            auVar33._20_4_ = auVar117._20_4_ * uStack_5c10._4_4_;
            auVar33._24_4_ = auVar117._24_4_ * (float)uStack_5c08;
            auVar33._28_4_ = auVar117._28_4_;
            auVar88 = vcmpps_avx(auVar78,auVar33,2);
            auVar87 = vandps_avx(auVar88,auVar87);
            auVar88 = auVar69 & auVar87;
            auVar54 = ZEXT436(auVar87._28_4_);
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar88 >> 0x7f,0) != '\0') ||
                  (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0xbf,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar88[0x1f] < '\0') {
              auVar69 = vandps_avx(auVar87,auVar69);
              auVar76 = ZEXT436(auVar69._28_4_);
              auVar87 = vcmpps_avx(ZEXT1632(auVar11),_DAT_01f7b000,4);
              auVar88 = auVar69 & auVar87;
              auVar54 = ZEXT436(auVar87._28_4_);
              if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar88 >> 0x7f,0) != '\0') ||
                    (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar88 >> 0xbf,0) != '\0') ||
                  (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar88[0x1f] < '\0') {
                uVar108 = ((local_5d70->scene->geometries).items[uVar61].ptr)->mask;
                auVar85._4_4_ = uVar108;
                auVar85._0_4_ = uVar108;
                auVar85._8_4_ = uVar108;
                auVar85._12_4_ = uVar108;
                auVar85._16_4_ = uVar108;
                auVar85._20_4_ = uVar108;
                auVar85._24_4_ = uVar108;
                auVar85._28_4_ = uVar108;
                auVar69 = vandps_avx(auVar87,auVar69);
                auVar76 = ZEXT436(auVar69._28_4_);
                auVar87 = vpand_avx2(auVar85,*(undefined1 (*) [32])pRVar4);
                auVar88 = vpcmpeqd_avx2(auVar87,_DAT_01f7b000);
                auVar83 = ZEXT436(auVar88._28_4_);
                auVar87 = auVar69 & ~auVar88;
                auVar54 = ZEXT436(auVar88._28_4_);
                if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar87 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar87 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar87 >> 0x7f,0) != '\0') ||
                      (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar87 >> 0xbf,0) != '\0') ||
                    (auVar87 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar87[0x1f] < '\0') {
                  auVar69 = vandnps_avx(auVar88,auVar69);
                  auVar76 = ZEXT436(auVar69._28_4_);
                  auVar69 = vandnps_avx(auVar69,auVar81);
                  auVar82 = ZEXT3264(auVar69);
                  goto LAB_016a3ba1;
                }
              }
            }
            auVar83 = auVar54;
            auVar82 = ZEXT3264(auVar81);
          }
        }
      }
LAB_016a3ba1:
      local_5da0 = auVar82._0_32_;
      fStack_5abc = local_5ac0;
      fStack_5ab8 = local_5ac0;
      fStack_5ab4 = local_5ac0;
      fStack_5ab0 = local_5ac0;
      fStack_5aac = local_5ac0;
      fStack_5aa8 = local_5ac0;
      fStack_5aa4 = local_5ac0;
      fStack_5a9c = local_5aa0;
      fStack_5a98 = local_5aa0;
      fStack_5a94 = local_5aa0;
      fStack_5a90 = local_5aa0;
      fStack_5a8c = local_5aa0;
      fStack_5a88 = local_5aa0;
      fStack_5a84 = local_5aa0;
      fStack_5a7c = local_5a80;
      fStack_5a78 = local_5a80;
      fStack_5a74 = local_5a80;
      fStack_5a70 = local_5a80;
      fStack_5a6c = local_5a80;
      fStack_5a68 = local_5a80;
      fStack_5a64 = local_5a80;
      fStack_5a5c = local_5a60;
      fStack_5a58 = local_5a60;
      fStack_5a54 = local_5a60;
      fStack_5a50 = local_5a60;
      fStack_5a4c = local_5a60;
      fStack_5a48 = local_5a60;
      fStack_5a44 = local_5a60;
      if ((((((((local_5da0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_5da0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_5da0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_5da0 >> 0x7f,0) == '\0') &&
            (auVar82 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(local_5da0 >> 0xbf,0) == '\0') &&
          (auVar82 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) && -1 < auVar82[0x1f])
      goto LAB_016a3f39;
      uVar58 = *(undefined4 *)(lVar63 + -0x50 + (long)pRVar59);
      auVar84._4_4_ = uVar58;
      auVar84._0_4_ = uVar58;
      auVar84._8_4_ = uVar58;
      auVar84._12_4_ = uVar58;
      auVar84._16_4_ = uVar58;
      auVar84._20_4_ = uVar58;
      auVar84._24_4_ = uVar58;
      auVar84._28_4_ = uVar58;
      uVar58 = *(undefined4 *)((long)&pRVar59[-2].flags + lVar63);
      auVar98._4_4_ = uVar58;
      auVar98._0_4_ = uVar58;
      auVar98._8_4_ = uVar58;
      auVar98._12_4_ = uVar58;
      auVar98._16_4_ = uVar58;
      auVar98._20_4_ = uVar58;
      auVar98._24_4_ = uVar58;
      auVar98._28_4_ = uVar58;
      uVar58 = *(undefined4 *)(lVar63 + -0x30 + (long)pRVar59);
      auVar103._4_4_ = uVar58;
      auVar103._0_4_ = uVar58;
      auVar103._8_4_ = uVar58;
      auVar103._12_4_ = uVar58;
      auVar103._16_4_ = uVar58;
      auVar103._20_4_ = uVar58;
      auVar103._24_4_ = uVar58;
      auVar103._28_4_ = uVar58;
      auVar40._4_4_ = local_5ac0;
      auVar40._0_4_ = local_5ac0;
      auVar40._8_4_ = local_5ac0;
      auVar40._12_4_ = local_5ac0;
      auVar40._16_4_ = local_5ac0;
      auVar40._20_4_ = local_5ac0;
      auVar40._24_4_ = local_5ac0;
      auVar40._28_4_ = local_5ac0;
      auVar69 = vsubps_avx(auVar84,auVar40);
      auVar42._4_4_ = local_5a80;
      auVar42._0_4_ = local_5a80;
      auVar42._8_4_ = local_5a80;
      auVar42._12_4_ = local_5a80;
      auVar42._16_4_ = local_5a80;
      auVar42._20_4_ = local_5a80;
      auVar42._24_4_ = local_5a80;
      auVar42._28_4_ = local_5a80;
      auVar87 = vsubps_avx(auVar98,auVar42);
      auVar41._4_4_ = local_5aa0;
      auVar41._0_4_ = local_5aa0;
      auVar41._8_4_ = local_5aa0;
      auVar41._12_4_ = local_5aa0;
      auVar41._16_4_ = local_5aa0;
      auVar41._20_4_ = local_5aa0;
      auVar41._24_4_ = local_5aa0;
      auVar41._28_4_ = local_5aa0;
      auVar88 = vsubps_avx(auVar103,auVar41);
      auVar89 = vsubps_avx(_local_5c80,auVar84);
      auVar81 = vsubps_avx(_local_5ca0,auVar98);
      auVar43._4_4_ = local_5a60;
      auVar43._0_4_ = local_5a60;
      auVar43._8_4_ = local_5a60;
      auVar43._12_4_ = local_5a60;
      auVar43._16_4_ = local_5a60;
      auVar43._20_4_ = local_5a60;
      auVar43._24_4_ = local_5a60;
      auVar43._28_4_ = local_5a60;
      auVar94 = vsubps_avx(auVar43,auVar103);
      auVar118._0_4_ = auVar94._0_4_ * auVar87._0_4_;
      auVar118._4_4_ = auVar94._4_4_ * auVar87._4_4_;
      auVar118._8_4_ = auVar94._8_4_ * auVar87._8_4_;
      auVar118._12_4_ = auVar94._12_4_ * auVar87._12_4_;
      auVar118._16_4_ = auVar94._16_4_ * auVar87._16_4_;
      auVar118._20_4_ = auVar94._20_4_ * auVar87._20_4_;
      auVar118._24_4_ = auVar94._24_4_ * auVar87._24_4_;
      auVar118._28_36_ = auVar76;
      auVar19 = vfmsub231ps_fma(auVar118._0_32_,auVar81,auVar88);
      auVar120._0_4_ = auVar88._0_4_ * auVar89._0_4_;
      auVar120._4_4_ = auVar88._4_4_ * auVar89._4_4_;
      auVar120._8_4_ = auVar88._8_4_ * auVar89._8_4_;
      auVar120._12_4_ = auVar88._12_4_ * auVar89._12_4_;
      auVar120._16_4_ = auVar88._16_4_ * auVar89._16_4_;
      auVar120._20_4_ = auVar88._20_4_ * auVar89._20_4_;
      auVar120._24_4_ = auVar88._24_4_ * auVar89._24_4_;
      auVar120._28_36_ = auVar83;
      auVar20 = vfmsub231ps_fma(auVar120._0_32_,auVar94,auVar69);
      auVar26._4_4_ = auVar81._4_4_ * auVar69._4_4_;
      auVar26._0_4_ = auVar81._0_4_ * auVar69._0_4_;
      auVar26._8_4_ = auVar81._8_4_ * auVar69._8_4_;
      auVar26._12_4_ = auVar81._12_4_ * auVar69._12_4_;
      auVar26._16_4_ = auVar81._16_4_ * auVar69._16_4_;
      auVar26._20_4_ = auVar81._20_4_ * auVar69._20_4_;
      auVar26._24_4_ = auVar81._24_4_ * auVar69._24_4_;
      auVar26._28_4_ = auVar69._28_4_;
      auVar21 = vfmsub231ps_fma(auVar26,auVar89,auVar87);
      auVar95 = vsubps_avx(auVar84,*(undefined1 (*) [32])local_5d80);
      auVar117 = vsubps_avx(auVar98,*(undefined1 (*) [32])(local_5d80 + 0x20));
      auVar119 = vsubps_avx(auVar103,*(undefined1 (*) [32])(local_5d80 + 0x40));
      auVar27._4_4_ = auVar119._4_4_ * auVar50._4_4_;
      auVar27._0_4_ = auVar119._0_4_ * auVar50._0_4_;
      auVar27._8_4_ = auVar119._8_4_ * auVar50._8_4_;
      auVar27._12_4_ = auVar119._12_4_ * auVar50._12_4_;
      auVar27._16_4_ = auVar119._16_4_ * auVar50._16_4_;
      auVar27._20_4_ = auVar119._20_4_ * auVar50._20_4_;
      auVar27._24_4_ = auVar119._24_4_ * (float)uStack_5b88;
      auVar27._28_4_ = uVar58;
      auVar16 = vfmsub231ps_fma(auVar27,auVar117,*(undefined1 (*) [32])pRVar2);
      auVar106._0_4_ = auVar95._0_4_ * auVar51._0_4_;
      auVar106._4_4_ = auVar95._4_4_ * auVar51._4_4_;
      auVar106._8_4_ = auVar95._8_4_ * auVar51._8_4_;
      auVar106._12_4_ = auVar95._12_4_ * auVar51._12_4_;
      auVar106._16_4_ = auVar95._16_4_ * auVar51._16_4_;
      auVar106._20_4_ = auVar95._20_4_ * auVar51._20_4_;
      auVar106._24_4_ = auVar95._24_4_ * fVar86;
      auVar106._28_36_ = auVar107;
      auVar17 = vfmsub231ps_fma(auVar106._0_32_,auVar119,*(undefined1 (*) [32])pRVar3);
      auVar28._4_4_ = auVar52._4_4_ * auVar117._4_4_;
      auVar28._0_4_ = auVar52._0_4_ * auVar117._0_4_;
      auVar28._8_4_ = auVar52._8_4_ * auVar117._8_4_;
      auVar28._12_4_ = auVar52._12_4_ * auVar117._12_4_;
      auVar28._16_4_ = auVar52._16_4_ * auVar117._16_4_;
      auVar28._20_4_ = auVar52._20_4_ * auVar117._20_4_;
      auVar28._24_4_ = (float)uStack_5bc8 * auVar117._24_4_;
      auVar28._28_4_ = uVar116;
      auVar18 = vfmsub231ps_fma(auVar28,auVar95,*(undefined1 (*) [32])pRVar1);
      auVar29._4_4_ = auVar94._4_4_ * auVar18._4_4_;
      auVar29._0_4_ = auVar94._0_4_ * auVar18._0_4_;
      auVar29._8_4_ = auVar94._8_4_ * auVar18._8_4_;
      auVar29._12_4_ = auVar94._12_4_ * auVar18._12_4_;
      auVar29._16_4_ = auVar94._16_4_ * 0.0;
      auVar29._20_4_ = auVar94._20_4_ * 0.0;
      auVar29._24_4_ = auVar94._24_4_ * 0.0;
      auVar29._28_4_ = auVar94._28_4_;
      auVar68 = vfmadd231ps_fma(auVar29,ZEXT1632(auVar17),auVar81);
      auVar30._4_4_ = auVar21._4_4_ * auVar51._4_4_;
      auVar30._0_4_ = auVar21._0_4_ * auVar51._0_4_;
      auVar30._8_4_ = auVar21._8_4_ * auVar51._8_4_;
      auVar30._12_4_ = auVar21._12_4_ * auVar51._12_4_;
      auVar30._16_4_ = auVar51._16_4_ * 0.0;
      auVar30._20_4_ = auVar51._20_4_ * 0.0;
      auVar30._24_4_ = fVar86 * 0.0;
      auVar30._28_4_ = auVar81._28_4_;
      auVar11 = vfmadd231ps_fma(auVar30,ZEXT1632(auVar20),*(undefined1 (*) [32])pRVar1);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar19),*(undefined1 (*) [32])pRVar3);
      auVar82 = ZEXT3264(local_5da0);
      auVar81 = vandps_avx(ZEXT1632(auVar11),local_5cc0);
      auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar16),auVar89);
      uVar108 = auVar81._0_4_;
      auVar124._0_4_ = auVar68._0_4_ ^ uVar108;
      uVar111 = auVar81._4_4_;
      auVar124._4_4_ = auVar68._4_4_ ^ uVar111;
      uVar112 = auVar81._8_4_;
      auVar124._8_4_ = auVar68._8_4_ ^ uVar112;
      uVar113 = auVar81._12_4_;
      auVar124._12_4_ = auVar68._12_4_ ^ uVar113;
      uVar58 = auVar81._16_4_;
      auVar124._16_4_ = uVar58;
      uVar114 = auVar81._20_4_;
      auVar124._20_4_ = uVar114;
      uVar115 = auVar81._24_4_;
      auVar124._24_4_ = uVar115;
      uVar15 = auVar81._28_4_;
      auVar124._28_4_ = uVar15;
      auVar81 = vcmpps_avx(auVar124,_DAT_01f7b000,5);
      in_ZMM15 = ZEXT3264(auVar81);
      auVar89 = local_5da0 & auVar81;
      _local_5ca0 = auVar87;
      _local_5c80 = auVar69;
      if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar89 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar89 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar89 >> 0x7f,0) == '\0') &&
            (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar89 >> 0xbf,0) == '\0') &&
          (auVar89 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar89[0x1f])
      {
LAB_016a3cd5:
        auVar118 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
      }
      else {
        auVar81 = vandps_avx(auVar81,local_5da0);
        in_ZMM15 = ZEXT3264(auVar81);
        auVar110._0_4_ = auVar88._0_4_ * auVar18._0_4_;
        auVar110._4_4_ = auVar88._4_4_ * auVar18._4_4_;
        auVar110._8_4_ = auVar88._8_4_ * auVar18._8_4_;
        auVar110._12_4_ = auVar88._12_4_ * auVar18._12_4_;
        auVar110._16_4_ = auVar88._16_4_ * 0.0;
        auVar110._20_4_ = auVar88._20_4_ * 0.0;
        auVar110._24_4_ = auVar88._24_4_ * 0.0;
        auVar110._28_4_ = 0;
        auVar68 = vfmadd213ps_fma(auVar87,ZEXT1632(auVar17),auVar110);
        auVar68 = vfmadd213ps_fma(auVar69,ZEXT1632(auVar16),ZEXT1632(auVar68));
        auVar104._0_4_ = uVar108 ^ auVar68._0_4_;
        auVar104._4_4_ = uVar111 ^ auVar68._4_4_;
        auVar104._8_4_ = uVar112 ^ auVar68._8_4_;
        auVar104._12_4_ = uVar113 ^ auVar68._12_4_;
        auVar104._16_4_ = uVar58;
        auVar104._20_4_ = uVar114;
        auVar104._24_4_ = uVar115;
        auVar104._28_4_ = uVar15;
        auVar69 = vcmpps_avx(auVar104,_DAT_01f7b000,5);
        auVar87 = auVar81 & auVar69;
        if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar87 >> 0x7f,0) == '\0') &&
              (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar87 >> 0xbf,0) == '\0') &&
            (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar87[0x1f]) goto LAB_016a3cd5;
        auVar87 = vandps_avx(ZEXT1632(auVar11),local_5c60);
        auVar81 = vandps_avx(auVar69,auVar81);
        auVar69 = vsubps_avx(auVar87,auVar124);
        auVar69 = vcmpps_avx(auVar69,auVar104,5);
        auVar88 = auVar81 & auVar69;
        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar88 >> 0x7f,0) == '\0') &&
              (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar88 >> 0xbf,0) == '\0') &&
            (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar88[0x1f]) goto LAB_016a3cd5;
        auVar81 = vandps_avx(auVar81,auVar69);
        auVar93._0_4_ = auVar119._0_4_ * auVar21._0_4_;
        auVar93._4_4_ = auVar119._4_4_ * auVar21._4_4_;
        auVar93._8_4_ = auVar119._8_4_ * auVar21._8_4_;
        auVar93._12_4_ = auVar119._12_4_ * auVar21._12_4_;
        auVar93._16_4_ = auVar119._16_4_ * 0.0;
        auVar93._20_4_ = auVar119._20_4_ * 0.0;
        auVar93._24_4_ = auVar119._24_4_ * 0.0;
        auVar93._28_4_ = 0;
        auVar68 = vfmadd213ps_fma(auVar117,ZEXT1632(auVar20),auVar93);
        auVar68 = vfmadd213ps_fma(auVar95,ZEXT1632(auVar19),ZEXT1632(auVar68));
        auVar66._0_4_ = auVar68._0_4_ ^ uVar108;
        auVar66._4_4_ = auVar68._4_4_ ^ uVar111;
        auVar66._8_4_ = auVar68._8_4_ ^ uVar112;
        auVar66._12_4_ = auVar68._12_4_ ^ uVar113;
        auVar66._16_4_ = uVar58;
        auVar66._20_4_ = uVar114;
        auVar66._24_4_ = uVar115;
        auVar66._28_4_ = uVar15;
        auVar73._0_4_ = auVar87._0_4_ * (float)local_5c00;
        auVar73._4_4_ = auVar87._4_4_ * local_5c00._4_4_;
        auVar73._8_4_ = auVar87._8_4_ * (float)uStack_5bf8;
        auVar73._12_4_ = auVar87._12_4_ * uStack_5bf8._4_4_;
        auVar73._16_4_ = auVar87._16_4_ * (float)uStack_5bf0;
        auVar73._20_4_ = auVar87._20_4_ * uStack_5bf0._4_4_;
        auVar73._24_4_ = auVar87._24_4_ * (float)uStack_5be8;
        auVar73._28_4_ = 0;
        auVar69 = vcmpps_avx(auVar73,auVar66,1);
        auVar79._0_4_ = auVar87._0_4_ * (float)local_5c20;
        auVar79._4_4_ = auVar87._4_4_ * local_5c20._4_4_;
        auVar79._8_4_ = auVar87._8_4_ * (float)uStack_5c18;
        auVar79._12_4_ = auVar87._12_4_ * uStack_5c18._4_4_;
        auVar79._16_4_ = auVar87._16_4_ * (float)uStack_5c10;
        auVar79._20_4_ = auVar87._20_4_ * uStack_5c10._4_4_;
        auVar79._24_4_ = auVar87._24_4_ * (float)uStack_5c08;
        auVar79._28_4_ = 0;
        auVar87 = vcmpps_avx(auVar66,auVar79,2);
        auVar69 = vandps_avx(auVar87,auVar69);
        auVar87 = auVar81 & auVar69;
        if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar87 >> 0x7f,0) == '\0') &&
              (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar87 >> 0xbf,0) == '\0') &&
            (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar87[0x1f]) {
LAB_016a3f1a:
          auVar118 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar82 = ZEXT3264(local_5da0);
        }
        else {
          auVar81 = vandps_avx(auVar69,auVar81);
          auVar69 = vcmpps_avx(ZEXT1632(auVar11),_DAT_01f7b000,4);
          auVar87 = auVar81 & auVar69;
          if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar87 >> 0x7f,0) == '\0') &&
                (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar87 >> 0xbf,0) == '\0') &&
              (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar87[0x1f]) goto LAB_016a3f1a;
          uVar108 = ((local_5d70->scene->geometries).items[uVar61].ptr)->mask;
          auVar80._4_4_ = uVar108;
          auVar80._0_4_ = uVar108;
          auVar80._8_4_ = uVar108;
          auVar80._12_4_ = uVar108;
          auVar80._16_4_ = uVar108;
          auVar80._20_4_ = uVar108;
          auVar80._24_4_ = uVar108;
          auVar80._28_4_ = uVar108;
          auVar81 = vandps_avx(auVar69,auVar81);
          auVar69 = vpand_avx2(auVar80,*(undefined1 (*) [32])pRVar4);
          auVar87 = vpcmpeqd_avx2(auVar69,_DAT_01f7b000);
          auVar69 = auVar81 & ~auVar87;
          if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar69 >> 0x7f,0) == '\0') &&
                (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar69 >> 0xbf,0) == '\0') &&
              (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar69[0x1f]) goto LAB_016a3f1a;
          auVar81 = vandnps_avx(auVar87,auVar81);
          auVar69 = vandnps_avx(auVar81,local_5da0);
          auVar81 = local_5da0 & ~auVar81;
          auVar82 = ZEXT3264(auVar69);
          auVar118 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar81 >> 0x7f,0) == '\0') &&
                (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar81 >> 0xbf,0) == '\0') &&
              (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar81[0x1f]) goto LAB_016a3f42;
        }
      }
      pRVar59 = (RTCIntersectArguments *)&pRVar59->feature_mask;
    } while( true );
  }
  goto LAB_016a3f78;
LAB_016a3f39:
  auVar118 = ZEXT3264(CONCAT428(0x7f800000,
                                CONCAT424(0x7f800000,
                                          CONCAT420(0x7f800000,
                                                    CONCAT416(0x7f800000,
                                                              CONCAT412(0x7f800000,
                                                                        CONCAT48(0x7f800000,
                                                                                 0x7f8000007f800000)
                                                                       ))))));
  auVar69 = local_5da0;
  local_5da0 = auVar81;
  local_5cc0 = auVar105;
LAB_016a3f42:
  auVar82 = ZEXT3264(local_5d40);
  auVar87 = vandps_avx(auVar69,local_5d40);
  lVar57 = lVar57 + 1;
  lVar63 = lVar63 + 0xe0;
  auVar69 = local_5d40 & auVar69;
  auVar81 = local_5d40;
  local_5d40 = auVar87;
  if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar69 >> 0x7f,0) == '\0') &&
        (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar69 >> 0xbf,0) == '\0') &&
      (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar69[0x1f])
  goto LAB_016a3f78;
  goto LAB_016a39d6;
LAB_016a3f78:
  auVar81 = vpcmpeqd_avx2(auVar81,auVar81);
  auVar67._0_4_ = local_5d40._0_4_ ^ auVar81._0_4_;
  auVar67._4_4_ = local_5d40._4_4_ ^ auVar81._4_4_;
  auVar67._8_4_ = local_5d40._8_4_ ^ auVar81._8_4_;
  auVar67._12_4_ = local_5d40._12_4_ ^ auVar81._12_4_;
  auVar67._16_4_ = local_5d40._16_4_ ^ auVar81._16_4_;
  auVar67._20_4_ = local_5d40._20_4_ ^ auVar81._20_4_;
  auVar67._24_4_ = local_5d40._24_4_ ^ auVar81._24_4_;
  auVar67._28_4_ = local_5d40._28_4_ ^ auVar81._28_4_;
  local_5d60 = vorps_avx(auVar67,local_5d60);
  auVar81 = auVar81 & ~local_5d60;
  if ((((((((auVar81 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar81 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar81 >> 0x7f,0) == '\0') &&
        (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar81 >> 0xbf,0) == '\0') &&
      (auVar81 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar81[0x1f])
  goto LAB_016a40b1;
  auVar74._8_4_ = 0xff800000;
  auVar74._0_8_ = 0xff800000ff800000;
  auVar74._12_4_ = 0xff800000;
  auVar74._16_4_ = 0xff800000;
  auVar74._20_4_ = 0xff800000;
  auVar74._24_4_ = 0xff800000;
  auVar74._28_4_ = 0xff800000;
  auVar82 = ZEXT3264(local_5840);
  local_5840 = vblendvps_avx(local_5840,auVar74,local_5d60);
  local_5c20 = uVar37;
  uStack_5c18 = uVar38;
  uStack_5c10 = uVar39;
  local_5c00 = uVar34;
  uStack_5bf8 = uVar35;
  uStack_5bf0 = uVar36;
  goto LAB_016a3713;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }